

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_add_slow(JSContext *ctx,JSValue *sp)

{
  JSValue *pJVar1;
  JSValue *pJVar2;
  int *piVar3;
  JSValue val;
  JSValueUnion JVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t tag;
  JSRuntime *rt;
  ulong uVar8;
  uint32_t tag_1;
  uint uVar9;
  JSRefCountHeader *p;
  JSValueUnion JVar10;
  anon_union_8_2_94730072 u;
  double dVar11;
  JSValue op1;
  JSValue op2;
  JSValue JVar12;
  double d1;
  JSValueUnion local_40;
  JSValueUnion local_38;
  
  pJVar1 = sp + -2;
  pJVar2 = sp + -1;
  piVar3 = (int *)(pJVar2->u).ptr;
  val = *pJVar2;
  JVar12 = *pJVar2;
  iVar5 = (int)sp[-2].tag;
  uVar9 = (uint)sp[-1].tag;
  if (((iVar5 == 7) || (iVar5 == 0)) &&
     ((op1 = *pJVar1, op2 = *pJVar2, uVar9 == 0 || (op1 = *pJVar1, op2 = val, uVar9 == 7)))) {
LAB_0013810e:
    val = op2;
    JVar10 = val.u;
    uVar9 = (uint)val.tag;
    if ((uint)op1.tag < 3) {
      JVar4.float64 = (double)op1.u._0_4_;
    }
    else {
      JVar4 = op1.u;
      if (((uint)op1.tag != 7) &&
         (iVar5 = __JS_ToFloat64Free(ctx,&local_40.float64,op1), JVar4 = local_40, iVar5 != 0)) {
        if ((uVar9 < 0xfffffff5) ||
           (iVar5 = *JVar10.ptr, *(int *)JVar10.ptr = iVar5 + -1, 1 < iVar5)) goto LAB_0013821c;
        rt = ctx->rt;
        goto LAB_00138169;
      }
    }
    local_40 = JVar4;
    if (uVar9 < 3) {
      JVar10.float64 = (double)val.u._0_4_;
    }
    else if ((uVar9 != 7) &&
            (iVar5 = __JS_ToFloat64Free(ctx,&local_38.float64,val), JVar10 = local_38, iVar5 != 0))
    goto LAB_0013821c;
    dVar11 = JVar10.float64 + local_40.float64;
    uVar7 = (ulong)dVar11 & 0xffffffff;
    uVar8 = (ulong)dVar11 & 0xffffffff00000000;
    if (dVar11 == (double)(int)dVar11) {
      uVar7 = (ulong)(uint)(int)dVar11;
      uVar8 = 0;
    }
    uVar6 = 7;
    if (dVar11 == (double)(int)dVar11) {
      uVar6 = 0;
    }
    sp[-2].u.ptr = (void *)(uVar7 | uVar8);
    sp[-2].tag = uVar6;
    return 0;
  }
  op1 = JS_ToPrimitiveFree(ctx,*pJVar1,2);
  if ((op1.tag & 0xffffffffU) == 6) {
    if ((uVar9 < 0xfffffff5) || (iVar5 = *piVar3, *piVar3 = iVar5 + -1, 1 < iVar5))
    goto LAB_0013821c;
    rt = ctx->rt;
  }
  else {
    op2 = JS_ToPrimitiveFree(ctx,JVar12,2);
    if ((op2.tag & 0xffffffffU) != 6) {
      if (((uint)op1.tag == 0xfffffff9) || ((int)op2.tag == -7)) {
        JVar12 = JS_ConcatString(ctx,op1,op2);
        sp[-2] = JVar12;
        if ((int)JVar12.tag != 6) {
          return 0;
        }
        goto LAB_0013821c;
      }
      goto LAB_0013810e;
    }
    if (((uint)op1.tag < 0xfffffff5) ||
       (iVar5 = *op1.u.ptr, *(int *)op1.u.ptr = iVar5 + -1, 1 < iVar5)) goto LAB_0013821c;
    rt = ctx->rt;
    val = op1;
  }
LAB_00138169:
  __JS_FreeValueRT(rt,val);
LAB_0013821c:
  sp[-2].u.int32 = 0;
  sp[-2].tag = 3;
  sp[-1].u.int32 = 0;
  sp[-1].tag = 3;
  return -1;
}

Assistant:

int js_add_slow(JSContext *ctx, JSValue *sp)
{
    JSValue op1, op2;
    uint32_t tag1, tag2;

    op1 = sp[-2];
    op2 = sp[-1];
    tag1 = JS_VALUE_GET_TAG(op1);
    tag2 = JS_VALUE_GET_TAG(op2);
    if ((tag1 == JS_TAG_INT || JS_TAG_IS_FLOAT64(tag1)) &&
        (tag2 == JS_TAG_INT || JS_TAG_IS_FLOAT64(tag2))) {
        goto add_numbers;
    } else {
        op1 = JS_ToPrimitiveFree(ctx, op1, HINT_NONE);
        if (JS_IsException(op1)) {
            JS_FreeValue(ctx, op2);
            goto exception;
        }
        op2 = JS_ToPrimitiveFree(ctx, op2, HINT_NONE);
        if (JS_IsException(op2)) {
            JS_FreeValue(ctx, op1);
            goto exception;
        }
        tag1 = JS_VALUE_GET_TAG(op1);
        tag2 = JS_VALUE_GET_TAG(op2);
        if (tag1 == JS_TAG_STRING || tag2 == JS_TAG_STRING) {
            sp[-2] = JS_ConcatString(ctx, op1, op2);
            if (JS_IsException(sp[-2]))
                goto exception;
        } else {
            double d1, d2;
        add_numbers:
            if (JS_ToFloat64Free(ctx, &d1, op1)) {
                JS_FreeValue(ctx, op2);
                goto exception;
            }
            if (JS_ToFloat64Free(ctx, &d2, op2))
                goto exception;
            sp[-2] = JS_NewFloat64(ctx, d1 + d2);
        }
    }
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}